

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

Value * __thiscall choc::value::Value::operator=(Value *this,ValueView *source)

{
  uint8_t *__dest;
  bool bVar1;
  Type *pTVar2;
  size_t sVar3;
  uchar *puVar4;
  void *__src;
  ValueView *source_local;
  Value *this_local;
  
  pTVar2 = ValueView::getType(source);
  sVar3 = Type::getValueDataSize(pTVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->packedData,sVar3);
  Type::operator=(&(this->value).type,&source->type);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->packedData);
  (this->value).data = puVar4;
  __dest = (this->value).data;
  __src = ValueView::getRawData(source);
  sVar3 = getRawDataSize(this);
  memcpy(__dest,__src,sVar3);
  std::vector<char,_std::allocator<char>_>::clear(&(this->dictionary).strings);
  if (source->stringDictionary != (StringDictionary *)0x0) {
    pTVar2 = ValueView::getType(source);
    bVar1 = Type::usesStrings(pTVar2);
    if (bVar1) {
      importStringHandles(this,&this->value,source->stringDictionary);
    }
  }
  return this;
}

Assistant:

inline Value& Value::operator= (const ValueView& source)
{
    packedData.resize (source.getType().getValueDataSize());
    value.type = source.type;
    value.data = packedData.data();
    memcpy (value.data, source.getRawData(), getRawDataSize());
    dictionary.strings.clear();

    if (source.stringDictionary != nullptr && source.getType().usesStrings())
        importStringHandles (value, *source.stringDictionary);

    return *this;
}